

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void open_func(LexState *ls,FuncState *fs,BlockCnt *bl)

{
  Proto *pPVar1;
  
  fs->prev = ls->fs;
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = -1;
  fs->nk = 0;
  fs->np = 0;
  fs->nlocvars = 0;
  fs->nactvar = '\0';
  fs->nups = '\0';
  fs->freereg = '\0';
  fs->firstlocal = (ls->dyd->actvar).n;
  fs->bl = (BlockCnt *)0x0;
  pPVar1 = fs->f;
  pPVar1->source = ls->source;
  pPVar1->maxstacksize = '\x02';
  enterblock(fs,bl,'\0');
  return;
}

Assistant:

static void open_func (LexState *ls, FuncState *fs, BlockCnt *bl) {
  Proto *f;
  fs->prev = ls->fs;  /* linked list of funcstates */
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = NO_JUMP;
  fs->freereg = 0;
  fs->nk = 0;
  fs->np = 0;
  fs->nups = 0;
  fs->nlocvars = 0;
  fs->nactvar = 0;
  fs->firstlocal = ls->dyd->actvar.n;
  fs->bl = NULL;
  f = fs->f;
  f->source = ls->source;
  f->maxstacksize = 2;  /* registers 0/1 are always valid */
  enterblock(fs, bl, 0);
}